

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageSync::Run(AdvancedUsageSync *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  GLuint GVar4;
  uint *puVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  char *format;
  ulong uVar11;
  int data [4];
  string local_78;
  string local_50;
  
  bVar3 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,3)
  ;
  lVar10 = 0x10;
  if (bVar3) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "\nlayout(std430, binding = 0) coherent buffer Buffer0 {\n  int g_data0, g_inc0;\n  int g_data1, g_inc1;\n};\nlayout(std430, binding = 1) buffer Buffer12 {\n  int inc, data;\n} g_buffer12[2];\n\nvoid Modify(int path) {\n  if (path == 0) {\n    atomicAdd(g_data0, g_inc0);\n    atomicAdd(g_data1, g_inc0);\n  } else if (path == 1) {\n    atomicAdd(g_data0, - g_inc0);\n    atomicAdd(g_data1, - g_inc0);\n  } else if (path == 2) {\n    atomicAdd(g_data0, g_inc1);\n    atomicAdd(g_data1, g_inc1);\n  }\n\n  if (path == 0) {\n    g_buffer12[0].data += g_buffer12[1].inc;\n  } else if (path == 1) {\n    g_buffer12[1].data += g_buffer12[0].inc;\n  }\n}\n\nvoid main() {\n  Modify(gl_VertexID);\n  gl_Position = vec4(0, 0, 0, 1);\n}"
               ,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "\nlayout(binding = 3, std430) coherent buffer Buffer3 {\n  int data;\n} g_buffer3;\nlayout(std430, binding = 4) coherent buffer Buffer4 {\n  int data0, inc0;\n  int data1, inc1;\n} g_buffer4;\nlayout(std430, binding = 5) buffer Buffer56 {\n  int inc, data;\n} g_buffer56[2];\n\nvoid ModifyFS(int path) {\n  if (path == 0) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc0);\n  } else if (path == 1) {\n    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);\n  } else if (path == 2) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc1);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc1);\n  }\n\n  if (path == 0) {\n    g_buffer56[0].data += g_buffer56[1].inc;\n  } else if (path == 1) {\n    g_buffer56[1].data += g_buffer56[0].inc;\n  }\n}\nvoid main() {\n  atomicAdd(g_buffer3.data, 1);\n  ModifyFS(gl_PrimitiveID);\n}"
               ,"");
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_78,&local_50);
    this->m_program = GVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar10 = -1;
    if (bVar3) {
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glGenBuffers(this_00,7,this->m_storage_buffer);
      local_78._M_dataplus._M_p = (pointer)0x100000000;
      local_78._M_string_length = 0x200000000;
      uVar11 = 0;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_78,0x88ea);
      local_78._M_dataplus._M_p = (pointer)0x100000003;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_78,0x88ea);
      local_78._M_dataplus._M_p = (pointer)0x400000002;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_78,0x88ea);
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&local_78,0x88ea);
      local_78._M_dataplus._M_p = (pointer)0x100000000;
      local_78._M_string_length = 0x200000000;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_78,0x88ea);
      local_78._M_dataplus._M_p = (pointer)0x100000003;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,5,this->m_storage_buffer[5]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_78,0x88ea);
      local_78._M_dataplus._M_p = (pointer)0x400000002;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,6,this->m_storage_buffer[6]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_78,0x88ea);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,3);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,3);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,&local_78);
      puVar5 = &DAT_01a92390;
      do {
        uVar9 = *(uint *)((long)&local_78._M_dataplus._M_p + uVar11 * 4);
        uVar8 = (ulong)uVar9;
        uVar7 = (ulong)*puVar5;
        if (uVar9 != *puVar5) {
          format = "[Buffer0] Data at index %d is %d should be %d.\n";
          goto LAB_00978d05;
        }
        uVar11 = uVar11 + 1;
        puVar5 = puVar5 + 1;
      } while (uVar11 != 4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
      uVar11 = 0;
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,8,&local_78);
      puVar5 = &DAT_01a949d8;
      do {
        uVar9 = *(uint *)((long)&local_78._M_dataplus._M_p + uVar11 * 4);
        uVar8 = (ulong)uVar9;
        uVar7 = (ulong)*puVar5;
        if (uVar9 != *puVar5) {
          format = "[Buffer1] Data at index %d is %d should be %d.\n";
          goto LAB_00978d05;
        }
        uVar11 = uVar11 + 1;
        puVar5 = puVar5 + 1;
      } while (uVar11 == 1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
      uVar11 = 0;
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,8,&local_78);
      puVar5 = &DAT_01a949e0;
      do {
        uVar9 = *(uint *)((long)&local_78._M_dataplus._M_p + uVar11 * 4);
        uVar8 = (ulong)uVar9;
        uVar7 = (ulong)*puVar5;
        if (uVar9 != *puVar5) {
          format = "[Buffer2] Data at index %d is %d should be %d.\n";
          goto LAB_00978d05;
        }
        uVar11 = uVar11 + 1;
        puVar5 = puVar5 + 1;
      } while (uVar11 == 1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&local_78);
      uVar8 = (ulong)local_78._M_dataplus._M_p & 0xffffffff;
      if ((uint)local_78._M_dataplus._M_p == 6) {
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
        uVar11 = 0;
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,&local_78);
        puVar5 = &DAT_01a92390;
        do {
          uVar9 = *(uint *)((long)&local_78._M_dataplus._M_p + uVar11 * 4);
          uVar8 = (ulong)uVar9;
          uVar7 = (ulong)*puVar5;
          if (uVar9 != *puVar5) {
            format = "[Buffer4] Data at index %d is %d should be %d.\n";
            goto LAB_00978d05;
          }
          uVar11 = uVar11 + 1;
          puVar5 = puVar5 + 1;
        } while (uVar11 != 4);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[5]);
        uVar11 = 0;
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,8,&local_78);
        puVar5 = &DAT_01a949d8;
        do {
          uVar9 = *(uint *)((long)&local_78._M_dataplus._M_p + uVar11 * 4);
          uVar8 = (ulong)uVar9;
          uVar7 = (ulong)*puVar5;
          if (uVar9 != *puVar5) {
            format = "[Buffer5] Data at index %d is %d should be %d.\n";
LAB_00978d05:
            uVar11 = uVar11 & 0xffffffff;
            goto LAB_00978d08;
          }
          uVar11 = uVar11 + 1;
          puVar5 = puVar5 + 1;
        } while (uVar11 == 1);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[6]);
        uVar9 = 0;
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,8,&local_78);
        if ((uint)local_78._M_dataplus._M_p == 2) {
          bVar2 = true;
          do {
            bVar3 = bVar2;
            if (!bVar3) goto LAB_00978d5b;
            bVar2 = false;
          } while (local_78._M_dataplus._M_p._4_4_ == 10);
          uVar6 = 10;
          uVar9 = 1;
          uVar1 = local_78._M_dataplus._M_p._4_4_;
        }
        else {
          uVar6 = 2;
          bVar3 = true;
          uVar1 = (uint)local_78._M_dataplus._M_p;
        }
        anon_unknown_0::Output
                  ("[Buffer6] Data at index %d is %d should be %d.\n",(ulong)uVar9,(ulong)uVar1,
                   uVar6);
LAB_00978d5b:
        lVar10 = -(ulong)bVar3;
      }
      else {
        format = "[Buffer3] Data at index %d is %d should be %d.\n";
        uVar11 = 0;
        uVar7 = 6;
LAB_00978d08:
        anon_unknown_0::Output(format,uVar11,uVar8,uVar7);
      }
    }
  }
  return lVar10;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(3))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(std430, binding = 0) coherent buffer Buffer0 {" NL "  int g_data0, g_inc0;" NL
			   "  int g_data1, g_inc1;" NL "};" NL "layout(std430, binding = 1) buffer Buffer12 {" NL
			   "  int inc, data;" NL "} g_buffer12[2];" NL NL "void Modify(int path) {" NL "  if (path == 0) {" NL
			   "    atomicAdd(g_data0, g_inc0);" NL "    atomicAdd(g_data1, g_inc0);" NL "  } else if (path == 1) {" NL
			   "    atomicAdd(g_data0, - g_inc0);" NL "    atomicAdd(g_data1, - g_inc0);" NL
			   "  } else if (path == 2) {" NL "    atomicAdd(g_data0, g_inc1);" NL "    atomicAdd(g_data1, g_inc1);" NL
			   "  }" NL NL "  if (path == 0) {" NL "    g_buffer12[0].data += g_buffer12[1].inc;" NL
			   "  } else if (path == 1) {" NL "    g_buffer12[1].data += g_buffer12[0].inc;" NL "  }" NL "}" NL NL
			   "void main() {" NL "  Modify(gl_VertexID);" NL "  gl_Position = vec4(0, 0, 0, 1);" NL "}";

		const char* glsl_fs =
			NL "layout(binding = 3, std430) coherent buffer Buffer3 {" NL "  int data;" NL "} g_buffer3;" NL
			   "layout(std430, binding = 4) coherent buffer Buffer4 {" NL "  int data0, inc0;" NL
			   "  int data1, inc1;" NL "} g_buffer4;" NL "layout(std430, binding = 5) buffer Buffer56 {" NL
			   "  int inc, data;" NL "} g_buffer56[2];" NL NL "void ModifyFS(int path) {" NL "  if (path == 0) {" NL
			   "    atomicAdd(g_buffer4.data0, g_buffer4.inc0);" NL "    atomicAdd(g_buffer4.data1, g_buffer4.inc0);" NL
			   "  } else if (path == 1) {" NL "    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);" NL
			   "    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);" NL "  } else if (path == 2) {" NL
			   "    atomicAdd(g_buffer4.data0, g_buffer4.inc1);" NL "    atomicAdd(g_buffer4.data1, g_buffer4.inc1);" NL
			   "  }" NL NL "  if (path == 0) {" NL "    g_buffer56[0].data += g_buffer56[1].inc;" NL
			   "  } else if (path == 1) {" NL "    g_buffer56[1].data += g_buffer56[0].inc;" NL "  }" NL "}" NL
			   "void main() {" NL "  atomicAdd(g_buffer3.data, 1);" NL "  ModifyFS(gl_PrimitiveID);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);
		glGenBuffers(7, m_storage_buffer);

		/* Buffer0 */
		{
			int data[4] = { 0, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer1 */
		{
			int data[2] = { 3, 1 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer2 */
		{
			int data[2] = { 2, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer3 */
		{
			int data[1] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer4 */
		{
			int data[4] = { 0, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer5 */
		{
			int data[2] = { 3, 1 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 5, m_storage_buffer[5]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer6 */
		{
			int data[2] = { 2, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 6, m_storage_buffer[6]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);

		glDrawArrays(GL_POINTS, 0, 3);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glDrawArrays(GL_POINTS, 0, 3);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* Buffer0 */
		{
			const int ref_data[4] = { 4, 1, 4, 2 };
			int		  data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 4; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer0] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer1 */
		{
			const int ref_data[2] = { 3, 5 };
			int		  data[2];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer1] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer2 */
		{
			const int ref_data[2] = { 2, 10 };
			int		  data[2];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer2] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer3 */
		{
			const int ref_data[1] = { 6 };
			int		  data[1];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 1; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer3] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer4 */
		{
			const int ref_data[4] = { 4, 1, 4, 2 };
			int		  data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 4; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer4] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer5 */
		{
			const int ref_data[2] = { 3, 5 };
			int		  data[2];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[5]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer5] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer6 */
		{
			const int ref_data[2] = { 2, 10 };
			int		  data[2];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[6]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer6] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}

		return NO_ERROR;
	}